

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendStamp.hpp
# Opt level: O1

void __thiscall OpenMD::BendStamp::setMembers(BendStamp *this,tuple<int,_int,_int> *tuple)

{
  vector<int,_std::allocator<int>_> *this_00;
  iterator iVar1;
  _Tuple_impl<1UL,_int,_int> local_20;
  int local_18 [2];
  
  local_18[0] = (tuple->super__Tuple_impl<0UL,_int,_int,_int>).super__Head_base<0UL,_int,_false>.
                _M_head_impl;
  local_20 = (tuple->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>;
  this_00 = &this->members_;
  iVar1._M_current =
       (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)this_00,iVar1,local_18);
  }
  else {
    *iVar1._M_current = local_18[0];
    (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)this_00,iVar1,
               &local_20.super__Head_base<1UL,_int,_false>._M_head_impl);
  }
  else {
    *iVar1._M_current = local_20.super__Head_base<1UL,_int,_false>._M_head_impl;
    (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)this_00,iVar1,(int *)&local_20);
  }
  else {
    *iVar1._M_current =
         (int)local_20.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
    (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void setMembers(const std::tuple<int, int, int>& tuple) {
      auto [first, second, third] = tuple;

      members_.push_back(first);
      members_.push_back(second);
      members_.push_back(third);
    }